

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void build_obmc_prediction
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *above_mbmi,void *fun_ctxt,int num_planes)

{
  MACROBLOCKD *pMVar1;
  int iVar2;
  buf_2d *pbVar3;
  byte in_CL;
  long lVar4;
  int in_EDX;
  int in_ESI;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000010;
  MV mv;
  buf_2d *pre_buf;
  int bh;
  int bw;
  macroblockd_plane *pd;
  int j;
  InterPredParams inter_pred_params;
  BLOCK_SIZE bsize;
  int mi_y;
  int mi_x;
  build_prediction_ctxt *ctxt;
  int in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe4c;
  InterPredParams *in_stack_fffffffffffffe50;
  int subsampling_y;
  undefined1 *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  MACROBLOCKD *in_stack_fffffffffffffe98;
  int_interpfilters local_144;
  int local_134;
  undefined1 auStack_100 [175];
  BLOCK_SIZE local_51;
  int local_50;
  int local_4c;
  long local_40;
  int local_38;
  byte local_31;
  int local_30;
  int local_2c;
  MACROBLOCKD *local_28;
  
  local_40 = in_R9;
  local_38 = in_R8D;
  local_31 = in_CL;
  local_30 = in_EDX;
  local_2c = in_ESI;
  local_28 = in_RDI;
  setup_address_for_obmc
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe90,
             (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (build_prediction_ctxt *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  local_4c = (local_28->mi_col + local_30) * 4;
  local_50 = (local_28->mi_row + local_2c) * 4;
  local_51 = (*local_28->mi)->bsize;
  for (local_134 = 0; pMVar1 = local_28, local_134 < in_stack_00000010; local_134 = local_134 + 1) {
    lVar4 = (long)local_134;
    if (local_38 == 0) {
      local_144.as_int =
           (int)((uint)local_31 << 2) >> ((byte)local_28->plane[lVar4].subsampling_x & 0x1f);
      clamp((int)(uint)block_size_high[local_51] >>
            ((char)local_28->plane[lVar4].subsampling_y + 1U & 0x1f),4,
            0x40 >> ((char)local_28->plane[lVar4].subsampling_y + 1U & 0x1f));
    }
    else {
      local_144.as_int =
           clamp((int)(uint)block_size_wide[local_51] >>
                 ((char)local_28->plane[lVar4].subsampling_x + 1U & 0x1f),4,
                 0x40 >> ((char)local_28->plane[lVar4].subsampling_x + 1U & 0x1f));
    }
    iVar2 = av1_skip_u4x4_pred_in_obmc
                      ((BLOCK_SIZE)((uint)in_stack_fffffffffffffe20 >> 0x18),
                       (macroblockd_plane *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),0);
    subsampling_y = (int)in_stack_fffffffffffffe70;
    if (iVar2 == 0) {
      pbVar3 = pMVar1->plane[lVar4].pre;
      in_stack_fffffffffffffe18 = pMVar1->plane[lVar4].subsampling_y;
      in_stack_fffffffffffffe20 = local_28->bd;
      is_cur_buf_hbd(local_28);
      iVar2 = 0;
      av1_init_inter_params
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,*(int *)(local_40 + 0x14),
                 (int)((ulong)pbVar3 >> 0x20),(int)pbVar3,
                 (int)((ulong)local_28->block_ref_scale_factors[0] >> 0x20),subsampling_y,
                 in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                 (scale_factors *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (buf_2d *)in_stack_fffffffffffffe98,local_144);
      in_stack_fffffffffffffe70 = auStack_100;
      get_conv_params(in_stack_fffffffffffffe34,iVar2,in_stack_fffffffffffffe2c);
      memcpy(in_stack_fffffffffffffe70,&stack0xfffffffffffffe78,0x30);
      av1_enc_build_one_inter_predictor
                ((uint8_t *)CONCAT44(in_stack_fffffffffffffe34,iVar2),in_stack_fffffffffffffe2c,
                 (MV *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (InterPredParams *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
  }
  return;
}

Assistant:

static inline void build_obmc_prediction(MACROBLOCKD *xd, int rel_mi_row,
                                         int rel_mi_col, uint8_t op_mi_size,
                                         int dir, MB_MODE_INFO *above_mbmi,
                                         void *fun_ctxt, const int num_planes) {
  struct build_prediction_ctxt *ctxt = (struct build_prediction_ctxt *)fun_ctxt;
  setup_address_for_obmc(xd, rel_mi_row, rel_mi_col, above_mbmi, ctxt,
                         num_planes);

  const int mi_x = (xd->mi_col + rel_mi_col) << MI_SIZE_LOG2;
  const int mi_y = (xd->mi_row + rel_mi_row) << MI_SIZE_LOG2;

  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  InterPredParams inter_pred_params;

  for (int j = 0; j < num_planes; ++j) {
    const struct macroblockd_plane *pd = &xd->plane[j];
    int bw = 0, bh = 0;

    if (dir) {
      // prepare left reference block size
      bw = clamp(block_size_wide[bsize] >> (pd->subsampling_x + 1), 4,
                 block_size_wide[BLOCK_64X64] >> (pd->subsampling_x + 1));
      bh = (op_mi_size << MI_SIZE_LOG2) >> pd->subsampling_y;
    } else {
      // prepare above reference block size
      bw = (op_mi_size * MI_SIZE) >> pd->subsampling_x;
      bh = clamp(block_size_high[bsize] >> (pd->subsampling_y + 1), 4,
                 block_size_high[BLOCK_64X64] >> (pd->subsampling_y + 1));
    }

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, dir)) continue;

    const struct buf_2d *const pre_buf = &pd->pre[0];
    const MV mv = above_mbmi->mv[0].as_mv;

    av1_init_inter_params(&inter_pred_params, bw, bh, mi_y >> pd->subsampling_y,
                          mi_x >> pd->subsampling_x, pd->subsampling_x,
                          pd->subsampling_y, xd->bd, is_cur_buf_hbd(xd), 0,
                          xd->block_ref_scale_factors[0], pre_buf,
                          above_mbmi->interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, j, xd->bd);

    av1_enc_build_one_inter_predictor(pd->dst.buf, pd->dst.stride, &mv,
                                      &inter_pred_params);
  }
}